

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

void tcu::astc::generateRandomValidBlocks
               (deUint8 *dst,size_t numBlocks,CompressedTexFormat format,AstcMode mode,deUint32 seed
               )

{
  bool bVar1;
  size_t sVar2;
  IVec3 blockSize;
  Random rnd;
  IVec3 local_4c;
  deRandom local_40;
  
  getBlockPixelSize((tcu *)&local_4c,format);
  deRandom_init(&local_40,seed);
  if (numBlocks != 0) {
    sVar2 = 0;
    do {
      do {
        anon_unknown_0::generateRandomBlock(dst + sVar2 * 0x10,&local_4c,(Random *)&local_40);
        bVar1 = isValidBlock(dst + sVar2 * 0x10,format,mode);
      } while (!bVar1);
      sVar2 = sVar2 + 1;
    } while (sVar2 != numBlocks);
  }
  return;
}

Assistant:

void generateRandomValidBlocks (deUint8* dst, size_t numBlocks, CompressedTexFormat format, TexDecompressionParams::AstcMode mode, deUint32 seed)
{
	const IVec3		blockSize			= getBlockPixelSize(format);
	de::Random		rnd					(seed);
	size_t			numBlocksGenerated	= 0;

	DE_ASSERT(isAstcFormat(format));
	DE_ASSERT(blockSize.z() == 1);

	for (numBlocksGenerated = 0; numBlocksGenerated < numBlocks; numBlocksGenerated++)
	{
		deUint8* const	curBlockPtr		= dst + numBlocksGenerated*BLOCK_SIZE_BYTES;

		do
		{
			generateRandomBlock(curBlockPtr, blockSize, rnd);
		} while (!isValidBlock(curBlockPtr, format, mode));
	}
}